

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O2

void __thiscall
fasttext::FastText::skipgram
          (FastText *this,Model *model,real lr,vector<int,_std::allocator<int>_> *line)

{
  pointer piVar1;
  result_type_conflict1 rVar2;
  uint uVar3;
  vector<int,_std::allocator<int>_> *input;
  int iVar4;
  int32_t w;
  ulong uVar5;
  uniform_int_distribution<int> uniform;
  uniform_int_distribution<int> local_38;
  
  local_38._M_param._M_b =
       ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->ws;
  local_38._M_param._M_a = 1;
  for (uVar5 = 0;
      uVar5 < (ulong)((long)(line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start >> 2); uVar5 = uVar5 + 1) {
    rVar2 = std::uniform_int_distribution<int>::operator()(&local_38,&model->rng);
    input = Dictionary::getNgrams
                      ((this->dict_).
                       super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       (line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start[uVar5]);
    for (iVar4 = -rVar2; iVar4 <= rVar2; iVar4 = iVar4 + 1) {
      if ((iVar4 != 0) && (uVar3 = (int)uVar5 + iVar4, -1 < (int)uVar3)) {
        piVar1 = (line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if ((ulong)uVar3 <
            (ulong)((long)(line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_finish - (long)piVar1 >> 2)) {
          Model::update(model,input,piVar1[uVar3],lr);
        }
      }
    }
  }
  return;
}

Assistant:

void FastText::skipgram(Model& model, real lr,
                        const std::vector<int32_t>& line) {
  std::uniform_int_distribution<> uniform(1, args_->ws);
  for (int32_t w = 0; w < line.size(); w++) {
    int32_t boundary = uniform(model.rng);
    const std::vector<int32_t>& ngrams = dict_->getNgrams(line[w]);
    for (int32_t c = -boundary; c <= boundary; c++) {
      if (c != 0 && w + c >= 0 && w + c < line.size()) {
        model.update(ngrams, line[w + c], lr);
      }
    }
  }
}